

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::minorUpdateRows(HEkkDual *this)

{
  long lVar1;
  HVector *in_RDI;
  double dVar2;
  double pivotX_1;
  HVector *next_ep_1;
  HighsInt ich_1;
  HighsInt i;
  double pivotX;
  HVector *next_ep;
  HighsInt ich;
  HVector_ptr multi_vector [8];
  double multi_xpivot [8];
  HighsInt multi_iwhich [8];
  HighsInt multi_nTasks;
  HighsInt updateRows_inDense;
  HVector *Row;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 uVar3;
  double in_stack_fffffffffffffef8;
  HighsSimplexAnalysis *in_stack_ffffffffffffff00;
  int local_f8;
  int local_f4;
  HVectorBase<double> *in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar4;
  double in_stack_ffffffffffffff48;
  HVectorBase<double> *in_stack_ffffffffffffff50;
  double local_78 [8];
  int aiStack_38 [8];
  int local_18;
  uint local_14;
  long local_10 [2];
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffff00,(HighsInt)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             SUB84(in_stack_fffffffffffffef8,0));
  local_10[0] = *(long *)&(&in_RDI[0x39].cwork)
                          [(long)*(int *)((long)&in_RDI[0x1e].array.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 4) * 5
                          ].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8;
  uVar3 = true;
  if (-1 < *(int *)(local_10[0] + 4)) {
    uVar3 = (double)*(int *)&(in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage * 0.1 <
            (double)*(int *)(local_10[0] + 4);
  }
  local_14 = (uint)(byte)uVar3;
  if (local_14 == 0) {
    for (local_f8 = 0;
        local_f8 <
        *(int *)&in_RDI[0x1e].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; local_f8 = local_f8 + 1) {
      if (-1 < *(int *)((long)in_RDI + (long)local_f8 * 0x248 + 0x14d8)) {
        in_stack_ffffffffffffff00 =
             (HighsSimplexAnalysis *)((long)in_RDI + (long)local_f8 * 0x248 + 0x1510);
        in_stack_fffffffffffffef8 =
             HighsSparseMatrix::computeDot
                       ((HighsSparseMatrix *)CONCAT17(uVar3,in_stack_fffffffffffffef0),in_RDI,0);
        if (1e-14 <= ABS(in_stack_fffffffffffffef8)) {
          HVectorBase<double>::saxpy<double,double>
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (HVectorBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          HVectorBase<double>::tight(in_stack_ffffffffffffff20);
          if (*(int *)((long)&(in_RDI->packValue).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4) == 2) {
            dVar2 = HVectorBase<double>::norm2(in_stack_ffffffffffffff20);
            *(double *)((long)in_RDI + (long)local_f8 * 0x248 + 0x1500) = dVar2;
          }
        }
      }
    }
  }
  else {
    local_18 = 0;
    for (iVar4 = 0;
        iVar4 < *(int *)&in_RDI[0x1e].array.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start; iVar4 = iVar4 + 1) {
      if (-1 < *(int *)((long)in_RDI + (long)iVar4 * 0x248 + 0x14d8)) {
        lVar1 = (long)in_RDI + (long)iVar4 * 0x248 + 0x1510;
        in_stack_ffffffffffffff30 =
             HighsSparseMatrix::computeDot
                       ((HighsSparseMatrix *)CONCAT17(uVar3,in_stack_fffffffffffffef0),in_RDI,0);
        if (1e-14 <= ABS(in_stack_ffffffffffffff30)) {
          *(long *)(&stack0xffffffffffffff48 + (long)local_18 * 8) = lVar1;
          local_78[local_18] =
               -in_stack_ffffffffffffff30 /
               *(double *)
                &in_RDI[0xb].cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 field_0x10;
          aiStack_38[local_18] = iVar4;
          local_18 = local_18 + 1;
        }
      }
    }
    ::highs::parallel::for_each<HEkkDual::minorUpdateRows()::__0>
              ((HighsInt)((ulong)in_stack_ffffffffffffff30 >> 0x20),
               SUB84(in_stack_ffffffffffffff30,0),(anon_class_32_4_068a6c9c *)in_RDI,
               (HighsInt)((ulong)local_10 >> 0x20));
    if (*(int *)((long)&(in_RDI->packValue).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 2) {
      for (local_f4 = 0; local_f4 < local_18; local_f4 = local_f4 + 1) {
        *(double *)((long)in_RDI + (long)aiStack_38[local_f4] * 0x248 + 0x1500) = local_78[local_f4]
        ;
      }
    }
  }
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffff00,(HighsInt)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             SUB84(in_stack_fffffffffffffef8,0));
  return;
}

Assistant:

void HEkkDual::minorUpdateRows() {
  analysis->simplexTimerStart(UpdateRowClock);
  const HVector* Row = multi_finish[multi_nFinish].row_ep;
  HighsInt updateRows_inDense =
      (Row->count < 0) || (Row->count > 0.1 * solver_num_row);
  if (updateRows_inDense) {
    HighsInt multi_nTasks = 0;
    HighsInt multi_iwhich[kSimplexConcurrencyLimit];
    double multi_xpivot[kSimplexConcurrencyLimit];
    HVector_ptr multi_vector[kSimplexConcurrencyLimit];

    /*
     * Dense mode
     *  1. Find which ones to do and the pivotX
     *  2. Do all of them in task parallel
     */

    // Collect tasks
    for (HighsInt ich = 0; ich < multi_num; ich++) {
      if (multi_choice[ich].row_out >= 0) {
        HVector* next_ep = &multi_choice[ich].row_ep;
        double pivotX = a_matrix->computeDot(*next_ep, variable_in);
        if (fabs(pivotX) < kHighsTiny) continue;
        multi_vector[multi_nTasks] = next_ep;
        multi_xpivot[multi_nTasks] = -pivotX / alpha_row;
        multi_iwhich[multi_nTasks] = ich;
        multi_nTasks++;
      }
    }

    // Perform tasks
    // #pragma omp parallel for schedule(dynamic)
    // printf("minorUpdatesRows: starting %d tasks\n", multi_nTasks);
    highs::parallel::for_each(
        0, multi_nTasks, [&](HighsInt start, HighsInt end) {
          for (HighsInt i = start; i < end; i++) {
            HVector_ptr nextEp = multi_vector[i];
            const double xpivot = multi_xpivot[i];
            nextEp->saxpy(xpivot, Row);
            nextEp->tight();
            if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
              multi_xpivot[i] = nextEp->norm2();
            }
          }
        });

    // Put weight back
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      for (HighsInt i = 0; i < multi_nTasks; i++)
        multi_choice[multi_iwhich[i]].infeasEdWt = multi_xpivot[i];
    }
  } else {
    // Sparse mode: just do it sequentially
    for (HighsInt ich = 0; ich < multi_num; ich++) {
      if (multi_choice[ich].row_out >= 0) {
        HVector* next_ep = &multi_choice[ich].row_ep;
        double pivotX = a_matrix->computeDot(*next_ep, variable_in);
        if (fabs(pivotX) < kHighsTiny) continue;
        next_ep->saxpy(-pivotX / alpha_row, Row);
        next_ep->tight();
        if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
          multi_choice[ich].infeasEdWt = next_ep->norm2();
        }
      }
    }
  }
  analysis->simplexTimerStop(UpdateRowClock);
}